

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

int * Wlc_VecLoadFanins(Vec_Int_t *vOut,int *pFanins,int nFanins,int nTotal,int fSigned)

{
  int *piVar1;
  int local_3c;
  int local_30;
  int local_2c;
  int i;
  int Fill;
  int fSigned_local;
  int nTotal_local;
  int nFanins_local;
  int *pFanins_local;
  Vec_Int_t *vOut_local;
  
  if (fSigned == 0) {
    local_30 = 0;
  }
  else {
    local_30 = pFanins[nFanins + -1];
  }
  Vec_IntClear(vOut);
  if (nFanins <= nTotal) {
    for (local_2c = 0; local_2c < nTotal; local_2c = local_2c + 1) {
      if (local_2c < nFanins) {
        local_3c = pFanins[local_2c];
      }
      else {
        local_3c = local_30;
      }
      Vec_IntPush(vOut,local_3c);
    }
    piVar1 = Vec_IntArray(vOut);
    return piVar1;
  }
  __assert_fail("nFanins <= nTotal",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                ,0x58,"int *Wlc_VecLoadFanins(Vec_Int_t *, int *, int, int, int)");
}

Assistant:

int * Wlc_VecLoadFanins( Vec_Int_t * vOut, int * pFanins, int nFanins, int nTotal, int fSigned )
{
    int Fill = fSigned ? pFanins[nFanins-1] : 0;
    int i; Vec_IntClear( vOut );
    assert( nFanins <= nTotal );
    for( i = 0; i < nTotal; i++) 
        Vec_IntPush( vOut, i < nFanins ? pFanins[i] : Fill );
    return Vec_IntArray( vOut );
}